

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

cJSON * cJSON_Duplicate(cJSON *item,cJSON_bool recurse)

{
  cJSON *item_00;
  uchar *puVar1;
  cJSON *pcVar2;
  undefined4 in_register_00000034;
  internal_hooks *hooks;
  cJSON *item_01;
  cJSON *pcVar3;
  
  hooks = (internal_hooks *)CONCAT44(in_register_00000034,recurse);
  if (item == (cJSON *)0x0) {
    return (cJSON *)0x0;
  }
  item_00 = (cJSON *)(*global_hooks.allocate)(0x40);
  if (item_00 == (cJSON *)0x0) {
    return (cJSON *)0x0;
  }
  item_00->valuedouble = 0.0;
  item_00->string = (char *)0x0;
  item_00->valuestring = (char *)0x0;
  *(undefined8 *)&item_00->valueint = 0;
  item_00->child = (cJSON *)0x0;
  *(undefined8 *)&item_00->type = 0;
  item_00->next = (cJSON *)0x0;
  item_00->prev = (cJSON *)0x0;
  item_00->type = item->type & 0xfffffeff;
  item_00->valueint = item->valueint;
  item_00->valuedouble = item->valuedouble;
  if ((uchar *)item->valuestring != (uchar *)0x0) {
    puVar1 = cJSON_strdup((uchar *)item->valuestring,hooks);
    item_00->valuestring = (char *)puVar1;
    if (puVar1 == (uchar *)0x0) goto LAB_00103a34;
  }
  puVar1 = (uchar *)item->string;
  if (puVar1 != (uchar *)0x0) {
    if ((item->type & 0x200) == 0) {
      puVar1 = cJSON_strdup(puVar1,hooks);
      item_00->string = (char *)puVar1;
      if (puVar1 == (uchar *)0x0) goto LAB_00103a34;
    }
    else {
      item_00->string = (char *)puVar1;
    }
  }
  if (recurse == 0) {
    return item_00;
  }
  item_01 = (cJSON *)&item->child;
  pcVar3 = (cJSON *)0x0;
  while( true ) {
    item_01 = item_01->next;
    if (item_01 == (cJSON *)0x0) {
      return item_00;
    }
    pcVar2 = cJSON_Duplicate(item_01,1);
    if (pcVar2 == (cJSON *)0x0) break;
    if (pcVar3 == (cJSON *)0x0) {
      item_00->child = pcVar2;
      pcVar3 = pcVar2;
    }
    else {
      pcVar3->next = pcVar2;
      pcVar2->prev = pcVar3;
      pcVar3 = pcVar2;
    }
  }
LAB_00103a34:
  cJSON_Delete(item_00);
  return (cJSON *)0x0;
}

Assistant:

CJSON_PUBLIC(cJSON *) cJSON_Duplicate(const cJSON *item, cJSON_bool recurse)
{
    cJSON *newitem = NULL;
    cJSON *child = NULL;
    cJSON *next = NULL;
    cJSON *newchild = NULL;

    /* Bail on bad ptr */
    if (!item)
    {
        goto fail;
    }
    /* Create new item */
    newitem = cJSON_New_Item(&global_hooks);
    if (!newitem)
    {
        goto fail;
    }
    /* Copy over all vars */
    newitem->type = item->type & (~cJSON_IsReference);
    newitem->valueint = item->valueint;
    newitem->valuedouble = item->valuedouble;
    if (item->valuestring)
    {
        newitem->valuestring = (char*)cJSON_strdup((unsigned char*)item->valuestring, &global_hooks);
        if (!newitem->valuestring)
        {
            goto fail;
        }
    }
    if (item->string)
    {
        newitem->string = (item->type&cJSON_StringIsConst) ? item->string : (char*)cJSON_strdup((unsigned char*)item->string, &global_hooks);
        if (!newitem->string)
        {
            goto fail;
        }
    }
    /* If non-recursive, then we're done! */
    if (!recurse)
    {
        return newitem;
    }
    /* Walk the ->next chain for the child. */
    child = item->child;
    while (child != NULL)
    {
        newchild = cJSON_Duplicate(child, true); /* Duplicate (with recurse) each item in the ->next chain */
        if (!newchild)
        {
            goto fail;
        }
        if (next != NULL)
        {
            /* If newitem->child already set, then crosswire ->prev and ->next and move on */
            next->next = newchild;
            newchild->prev = next;
            next = newchild;
        }
        else
        {
            /* Set newitem->child and move to it */
            newitem->child = newchild;
            next = newchild;
        }
        child = child->next;
    }

    return newitem;

fail:
    if (newitem != NULL)
    {
        cJSON_Delete(newitem);
    }

    return NULL;
}